

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall FastExp_Accuracy_Test::~FastExp_Accuracy_Test(FastExp_Accuracy_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FastExp, Accuracy) {
    EXPECT_EQ(1, FastExp(0));

    Float maxErr = 0;
    RNG rng(6502);
    for (int i = 0; i < 100; ++i) {
        Float v = Lerp(rng.Uniform<Float>(), -20.f, 20.f);
        Float f = FastExp(v);
        Float e = std::exp(v);
        Float err = std::abs((f - e) / e);
        maxErr = std::max(err, maxErr);
        EXPECT_LE(err, 0.0003f) << "At " << v << ", fast = " << f << ", accurate = " << e
                                << " -> relative error = " << err;
    }
#if 0
    fprintf(stderr, "max error %f\n", maxErr);

    // performance
    Float sum = 0;
    std::chrono::steady_clock::time_point start =
            std::chrono::steady_clock::now();
    for (int i = 0; i < 10000000; ++i) {
        Float v = Lerp(rng.Uniform<Float>(), -20.f, 20.f);
        sum += std::exp(v);
    }
    std::chrono::steady_clock::time_point now =
            std::chrono::steady_clock::now();
    Float elapsedMS =
        std::chrono::duration_cast<std::chrono::microseconds>(now - start)
        .count() / 1000.;
    fprintf(stderr, "%.3f ms\n", (Float)elapsedMS);

    EXPECT_NE(sum, 0); // use it
#endif
}